

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O0

optional<pbrt::Token> * __thiscall
pstd::optional<pbrt::Token>::operator=(optional<pbrt::Token> *this,optional<pbrt::Token> *v)

{
  bool bVar1;
  optional<pbrt::Token> *this_00;
  Token *__src;
  optional<pbrt::Token> *in_RSI;
  optional<pbrt::Token> *in_RDI;
  optional<pbrt::Token> *in_stack_ffffffffffffffe0;
  
  reset(in_stack_ffffffffffffffe0);
  bVar1 = has_value(in_RSI);
  if (bVar1) {
    this_00 = (optional<pbrt::Token> *)ptr((optional<pbrt::Token> *)0x4fc287);
    __src = value(this_00);
    memcpy(this_00,__src,0x28);
    in_RDI->set = true;
    reset(this_00);
  }
  return in_RDI;
}

Assistant:

PBRT_CPU_GPU
    optional &operator=(optional &&v) {
        reset();
        if (v.has_value()) {
            new (ptr()) T(std::move(v.value()));
            set = true;
            v.reset();
        }
        return *this;
    }